

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O3

CharString * __thiscall
icu_63::CharString::appendInvariantChars(CharString *this,UnicodeString *s,UErrorCode *errorCode)

{
  ushort uVar1;
  char16_t *uchars;
  CharString *pCVar2;
  int32_t ucharsLen;
  
  uVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      uchars = (s->fUnion).fFields.fArray;
    }
    else {
      uchars = (s->fUnion).fStackFields.fBuffer;
    }
  }
  else {
    uchars = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    ucharsLen = (s->fUnion).fFields.fLength;
  }
  else {
    ucharsLen = (int)(short)uVar1 >> 5;
  }
  pCVar2 = appendInvariantChars(this,uchars,ucharsLen,errorCode);
  return pCVar2;
}

Assistant:

CharString &CharString::appendInvariantChars(const UnicodeString &s, UErrorCode &errorCode) {
    return appendInvariantChars(s.getBuffer(), s.length(), errorCode);
}